

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

void * ShrinkUnits(CPpmd8 *p,void *oldPtr,uint oldNU,uint newNU)

{
  Byte *pBVar1;
  byte bVar2;
  Byte *pBVar3;
  uint newIndx;
  uint oldIndx;
  long lVar4;
  
  bVar2 = p->Units2Indx[newNU - 1];
  if (p->Units2Indx[oldNU - 1] != bVar2) {
    newIndx = (uint)bVar2;
    oldIndx = (uint)p->Units2Indx[oldNU - 1];
    if (p->FreeList[bVar2] == 0) {
      SplitBlock(p,oldPtr,oldIndx,newIndx);
    }
    else {
      pBVar3 = p->Base;
      pBVar1 = pBVar3 + p->FreeList[newIndx];
      p->FreeList[newIndx] = *(CPpmd_Void_Ref *)(pBVar3 + (ulong)p->FreeList[newIndx] + 4);
      p->Stamps[newIndx] = p->Stamps[newIndx] - 1;
      lVar4 = 0;
      do {
        *(undefined4 *)(pBVar1 + lVar4) = *(undefined4 *)((long)oldPtr + lVar4);
        *(undefined4 *)(pBVar1 + lVar4 + 4) = *(undefined4 *)((long)oldPtr + lVar4 + 4);
        *(undefined4 *)(pBVar1 + lVar4 + 8) = *(undefined4 *)((long)oldPtr + lVar4 + 8);
        lVar4 = lVar4 + 0xc;
        newNU = newNU - 1;
      } while (newNU != 0);
      *(undefined4 *)oldPtr = 0xffffffff;
      *(CPpmd_Void_Ref *)((long)oldPtr + 4) = p->FreeList[oldIndx];
      *(uint *)((long)oldPtr + 8) = (uint)p->Indx2Units[oldIndx];
      p->FreeList[oldIndx] = (int)oldPtr - (int)pBVar3;
      p->Stamps[oldIndx] = p->Stamps[oldIndx] + 1;
      oldPtr = pBVar1;
    }
  }
  return oldPtr;
}

Assistant:

static void *ShrinkUnits(CPpmd8 *p, void *oldPtr, unsigned oldNU, unsigned newNU)
{
  unsigned i0 = U2I(oldNU);
  unsigned i1 = U2I(newNU);
  if (i0 == i1)
    return oldPtr;
  if (p->FreeList[i1] != 0)
  {
    void *ptr = RemoveNode(p, i1);
    MyMem12Cpy(ptr, oldPtr, newNU);
    InsertNode(p, oldPtr, i0);
    return ptr;
  }
  SplitBlock(p, oldPtr, i0, i1);
  return oldPtr;
}